

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

map_value map_remove(map m,map_key key)

{
  int iVar1;
  void **value_00;
  void *in_RSI;
  comparable_callback in_RDI;
  map_value value;
  bucket b;
  size_t index;
  map_hash h;
  bucket in_stack_fffffffffffffff8;
  
  if ((in_RDI == (comparable_callback)0x0) || (in_RSI == (void *)0x0)) {
    log_write_impl_va("metacall",0x135,"map_remove",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,3,"Invalid map remove parameters");
  }
  else {
    value_00 = (void **)(**(code **)(in_RDI + 0x20))(in_RSI);
    iVar1 = bucket_remove(in_stack_fffffffffffffff8,in_RDI,in_RSI,value_00);
    if (iVar1 == 0) {
      *(long *)in_RDI = *(long *)in_RDI + -1;
      iVar1 = map_bucket_realloc((map)h);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x149,"map_remove",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                          ,3,"Invalid map bucket remove reallocation");
      }
    }
    else {
      log_write_impl_va("metacall",0x141,"map_remove",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Invalid map bucket remove: %p",in_RSI);
    }
  }
  return (map_value)0x0;
}

Assistant:

map_value map_remove(map m, map_key key)
{
	map_hash h;
	size_t index;
	bucket b;
	map_value value = NULL;

	if (m == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map remove parameters");
		return NULL;
	}

	h = m->hash_cb(key);

	index = h % m->capacity;

	b = &m->buckets[index];

	if (bucket_remove(b, m->compare_cb, key, &value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove: %p", key);
		return NULL;
	}

	--m->count;

	if (map_bucket_realloc(m) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove reallocation");
		return NULL;
	}

	return value;
}